

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastArgumentsLdElemI(Lowerer *this,Instr *ldElem,LabelInstr *labelFallThru)

{
  Func *func;
  RegOpnd *indexOpnd;
  code *pcVar1;
  IntConstType instr;
  LabelInstr *target;
  Lowerer *pLVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  OpCode opCode;
  int iVar6;
  undefined4 *puVar7;
  IntConstOpnd *src1;
  Instr *pIVar8;
  IntConstOpnd *src2;
  IndirOpnd *pIVar9;
  undefined4 extraout_var;
  AddrOpnd *pAVar10;
  undefined4 extraout_var_00;
  undefined1 *puVar11;
  IntConstType local_60;
  IntConstType value;
  LabelInstr *local_50;
  LabelInstr *local_48;
  Lowerer *local_40;
  bool local_31 [8];
  bool isNotInt;
  
  local_50 = labelFallThru;
  local_40 = this;
  bVar3 = IR::Instr::DoStackArgsOpt(ldElem);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5697,"(ldElem->DoStackArgsOpt())","ldElem->DoStackArgsOpt()");
    if (!bVar3) goto LAB_005d91ce;
    *puVar7 = 0;
  }
  pIVar9 = (IndirOpnd *)ldElem->m_src1;
  OVar4 = IR::Opnd::GetKind((Opnd *)pIVar9);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) {
LAB_005d91ce:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  bVar3 = Func::IsInlinee(ldElem->m_func);
  func = ldElem->m_func;
  value = (IntConstType)IR::LabelInstr::New(Label,func,true);
  local_31[0] = false;
  local_60 = 0;
  indexOpnd = pIVar9->m_indexOpnd;
  bVar5 = IR::IndirOpnd::TryGetIntConstIndexValue(pIVar9,true,&local_60,local_31);
  if (local_31[0] != false) {
LAB_005d91b0:
    puVar11 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar11 = 0x2a;
    __cxa_throw(puVar11,&Js::RejitException::typeinfo,0);
  }
  if ((bVar5) &&
     ((local_60 < 0 || ((bVar3 && ((long)((ulong)ldElem->m_func->actualCount - 1) <= local_60))))))
  {
    iVar6 = (*ldElem->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
    pAVar10 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar6),AddrOpndKindDynamicVar,
                                ldElem->m_func,true,(Var)0x0);
    InsertMove(ldElem->m_dst,&pAVar10->super_Opnd,ldElem,true);
    InsertBranch(Br,false,local_50,ldElem);
    return true;
  }
  if (local_50 == (LabelInstr *)0x0) goto LAB_005d91b0;
  local_48 = IR::LabelInstr::New(Label,func,true);
  pLVar2 = local_40;
  if (bVar3) {
    src1 = IR::IntConstOpnd::New((ulong)ldElem->m_func->actualCount - 1,TyInt32,func,false);
  }
  else {
    pIVar8 = LowererMD::LoadInputParamCount(&local_40->m_lowererMD,ldElem,-1,false);
    src1 = (IntConstOpnd *)IR::Opnd::UseWithNewType(pIVar8->m_dst,TyInt32,pLVar2->m_func);
  }
  if (bVar5) {
    src2 = IR::IntConstOpnd::New(local_60,TyInt32,func,false);
  }
  else {
    src2 = (IntConstOpnd *)
           LowererMD::LoadNonnegativeIndex
                     (&local_40->m_lowererMD,indexOpnd,(indexOpnd->super_Opnd).m_type == TyUint32,
                      local_48,local_48,ldElem);
  }
  if (bVar3) {
    if (bVar5) goto LAB_005d9098;
    InsertCompare(&src2->super_Opnd,&src1->super_Opnd,ldElem);
    opCode = BrGe_A;
  }
  else {
    InsertCompare(&src1->super_Opnd,&src2->super_Opnd,ldElem);
    opCode = BrLe_A;
  }
  InsertBranch(opCode,true,local_48,ldElem);
LAB_005d9098:
  if (bVar3) {
    pIVar9 = GetArgsIndirOpndForInlinee(local_40,ldElem,&src2->super_Opnd);
  }
  else {
    pIVar9 = GetArgsIndirOpndForTopFunction(local_40,ldElem,&src2->super_Opnd);
  }
  instr = value;
  InsertMove(ldElem->m_dst,&pIVar9->super_Opnd,ldElem,true);
  target = local_50;
  InsertBranch(Br,false,local_50,ldElem);
  IR::Instr::InsertBefore(ldElem,&local_48->super_Instr);
  iVar6 = (*ldElem->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
  pAVar10 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar6),AddrOpndKindDynamicVar,ldElem->m_func,
                              true,(Var)0x0);
  InsertMove(ldElem->m_dst,&pAVar10->super_Opnd,ldElem,true);
  InsertBranch(Br,false,target,ldElem);
  IR::Instr::InsertBefore(ldElem,(Instr *)instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastArgumentsLdElemI(IR::Instr* ldElem, IR::LabelInstr *labelFallThru)
{
    //  ---GenerateSmIntTest
    //  ---GenerateLdValueFromCheckedIndexOpnd
    //  ---LoadInputParamCount
    //  CMP actualParamOpnd, valueOpnd //Compare between the actual count & the index count (say i in arguments[i])
    //  JLE $labelReturnUndefined
    //  MOV dst, ebp [(valueOpnd + 5) *4]  // 5 for the stack layout
    //  JMP $fallthrough
    //
    //labelReturnUndefined:
    //  MOV dst, undefined
    //  JMP $fallthrough
    //
    //labelCreateHeapArgs:
    //  ---Bail out to create Heap Arguments object

    Assert(ldElem->DoStackArgsOpt());

    IR::IndirOpnd *indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    bool isInlinee = ldElem->m_func->IsInlinee();
    Func *func = ldElem->m_func;

    IR::LabelInstr *labelCreateHeapArgs = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    // Now load the index and check if it is an integer.
    bool emittedFastPath = false;
    bool isNotInt = false;
    IntConstType   value = 0;
    IR::RegOpnd   *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::Opnd      *valueOpnd = nullptr;
    IR::Opnd      *actualParamOpnd = nullptr;

    bool hasIntConstIndex = indirOpnd->TryGetIntConstIndexValue(true, &value, &isNotInt);

    if (isNotInt)
    {
        //Not an int disable optimisation and rejit
    }
    else if (hasIntConstIndex && (value < 0 || (isInlinee && value >= (ldElem->m_func->actualCount - 1))))
    {
        // if the index is an int const outside the range then the value must be undefined
        // this is ensured as GlobOpt::OptArguments disables the Arguments optimisation if the arguments object is modified
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
        emittedFastPath = true;
    }
    else if (labelFallThru != nullptr)
    {
        IR::LabelInstr *labelReturnUndefined = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        if (isInlinee)
        {
            actualParamOpnd = IR::IntConstOpnd::New(ldElem->m_func->actualCount - 1, TyInt32, func);
        }
        else
        {
            // Load actuals count, LoadHeapArguments will reuse the generated instructions here
            IR::Instr      *loadInputParamCountInstr = this->m_lowererMD.LoadInputParamCount(ldElem, -1 /* don't include 'this' while counting actuals. */);
            actualParamOpnd = loadInputParamCountInstr->GetDst()->UseWithNewType(TyInt32,this->m_func);
        }

        if (hasIntConstIndex)
        {
            //Constant index
            valueOpnd = IR::IntConstOpnd::New(value, TyInt32, func);
        }
        else
        {
            //Load valueOpnd from the index, note this operation includes a bail-out for non-integer indices
            valueOpnd =
                m_lowererMD.LoadNonnegativeIndex(
                    indexOpnd,
                    (
#if INT32VAR
                        indexOpnd->GetType() == TyUint32
#else
                        // On 32-bit platforms, skip the negative check since for now, the unsigned upper bound check covers it
                        true
#endif
                        ),
                    labelReturnUndefined,
                    labelReturnUndefined,
                    ldElem);
        }

        if (isInlinee)
        {
            if (!hasIntConstIndex)
            {
                //Runtime check to make sure length is within the arguments.length range.
                GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, valueOpnd, actualParamOpnd, Js::OpCode::BrGe_A);
            }
        }
        else
        {
            GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, actualParamOpnd, valueOpnd, Js::OpCode::BrLe_A);
        }

        IR::Opnd *argIndirOpnd = nullptr;
        if (isInlinee)
        {
            argIndirOpnd = GetArgsIndirOpndForInlinee(ldElem, valueOpnd);
        }
        else
        {
            argIndirOpnd = GetArgsIndirOpndForTopFunction(ldElem, valueOpnd);
        }

        Lowerer::InsertMove(ldElem->GetDst(), argIndirOpnd, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // if load is outside of range at runtime return false
        ldElem->InsertBefore(labelReturnUndefined);
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // $labelCreateHeapArgs:
        ldElem->InsertBefore(labelCreateHeapArgs);
        emittedFastPath = true;
    }

    if (!emittedFastPath)
    {
        throw Js::RejitException(RejitReason::DisableStackArgOpt);
    }

    return emittedFastPath;
}